

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricTracerDisableExp
          (zet_metric_tracer_exp_handle_t hMetricTracer,ze_bool_t synchronous)

{
  zet_pfnMetricTracerDisableExp_t pfnDisableExp;
  ze_result_t result;
  ze_bool_t synchronous_local;
  zet_metric_tracer_exp_handle_t hMetricTracer_local;
  
  pfnDisableExp._0_4_ = ZE_RESULT_SUCCESS;
  if (_DAT_0011c7c8 != (code *)0x0) {
    pfnDisableExp._0_4_ = (*_DAT_0011c7c8)(hMetricTracer,synchronous);
  }
  return (ze_result_t)pfnDisableExp;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricTracerDisableExp(
        zet_metric_tracer_exp_handle_t hMetricTracer,   ///< [in] handle of the metric tracer
        ze_bool_t synchronous                           ///< [in] request synchronous behavior. Confirmation of successful
                                                        ///< asynchronous operation is done by calling ::zetMetricTracerReadDataExp()
                                                        ///< and checking the return status: ::ZE_RESULT_SUCCESS will be returned
                                                        ///< when the tracer is active or when it is inactive but still has data. 
                                                        ///< ::ZE_RESULT_NOT_READY will be returned when the tracer is inactive and
                                                        ///< has no more data to be retrieved.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDisableExp = context.zetDdiTable.MetricTracerExp.pfnDisableExp;
        if( nullptr != pfnDisableExp )
        {
            result = pfnDisableExp( hMetricTracer, synchronous );
        }
        else
        {
            // generic implementation
        }

        return result;
    }